

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

bool __thiscall tf::Executor::_invoke_async_task(Executor *this,Worker *worker,Node *node)

{
  __index_type _Var1;
  function<void_(tf::Runtime_&)> fVar2;
  bool bVar3;
  undefined8 uVar4;
  function<void_(tf::Runtime_&)> *pfVar5;
  function<void_(tf::Runtime_&)> *work;
  _Hash_node_base *p_Var6;
  
  _Var1 = *(__index_type *)
           ((long)&(node->_handle).
                   super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           + 0x38);
  work = (function<void_(tf::Runtime_&)> *)0x0;
  if (_Var1 == '\a') {
    work = (function<void_(tf::Runtime_&)> *)&node->_handle;
  }
  fVar2 = work[0x20];
  if (fVar2 == (function<void_(tf::Runtime_&)>)0x2) {
    bVar3 = _invoke_runtime_task_impl(this,worker,node,(function<void_(tf::Runtime_&,_bool)> *)work)
    ;
  }
  else {
    if (fVar2 != (function<void_(tf::Runtime_&)>)0x1) {
      if (fVar2 != (function<void_(tf::Runtime_&)>)0x0) {
        return false;
      }
      for (p_Var6 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0
          ; p_Var6 = p_Var6->_M_nxt) {
        (*(code *)(p_Var6[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var6[1]._M_nxt,worker,node);
      }
      pfVar5 = (function<void_(tf::Runtime_&)> *)0x0;
      if ((_Var1 == '\a') && (work[0x20] == (function<void_(tf::Runtime_&)>)0x0)) {
        pfVar5 = work;
      }
      if (*(long *)(pfVar5 + 0x10) == 0) {
        uVar4 = std::__throw_bad_function_call();
        __cxa_begin_catch(uVar4);
        _process_exception(this,worker,node);
        __cxa_end_catch();
      }
      else {
        (**(code **)(pfVar5 + 0x18))();
      }
      for (p_Var6 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0
          ; p_Var6 = p_Var6->_M_nxt) {
        (*(code *)(p_Var6[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var6[1]._M_nxt,worker,node);
      }
      return false;
    }
    bVar3 = _invoke_runtime_task_impl(this,worker,node,work);
  }
  if (bVar3 == false) {
    return false;
  }
  return true;
}

Assistant:

inline bool Executor::_invoke_async_task(Worker& worker, Node* node) {
  auto& work = std::get_if<Node::Async>(&node->_handle)->work;
  switch(work.index()) {
    // void()
    case 0:
      _observer_prologue(worker, node);
      TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
        std::get_if<0>(&work)->operator()();
      });
      _observer_epilogue(worker, node);
    break;
    
    // void(Runtime&)
    case 1:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<1>(&work))) {
        return true;
      }
    break;
    
    // void(Runtime&, bool)
    case 2:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<2>(&work))) {
        return true;
      }
    break;
  }

  return false;
}